

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmobj.cpp
# Opt level: O0

int __thiscall CVmObjTable::init(CVmObjTable *this,EVP_PKEY_CTX *ctx)

{
  CVmObjPageEntry **ppCVar1;
  CVmHashTable *pCVar2;
  CVmObjNil *this_00;
  CVmObjPageEntry *pCVar3;
  CVmObjPageEntry *obj0;
  CVmHashTable *in_stack_ffffffffffffffe0;
  CVmObjTable *in_stack_fffffffffffffff0;
  
  this->page_slots_ = 10;
  ppCVar1 = (CVmObjPageEntry **)malloc(this->page_slots_ << 3);
  this->pages_ = ppCVar1;
  if (this->pages_ == (CVmObjPageEntry **)0x0) {
    err_throw(0);
  }
  this->pages_used_ = 0;
  this->first_free_ = 0;
  this->gc_queue_head_ = 0;
  this->finalize_queue_head_ = 0;
  this->allocs_since_gc_ = 0;
  this->bytes_since_gc_ = 0;
  this->max_allocs_between_gc_ = 10000;
  this->max_bytes_between_gc_ = 0x600000;
  this->field_0x78 = this->field_0x78 | 1;
  this->image_ptr_head_ = (vm_image_ptr_page *)0x0;
  this->image_ptr_tail_ = (vm_image_ptr_page *)0x0;
  this->image_ptr_last_cnt_ = 0;
  this->globals_ = (CVmObjGlobPage *)0x0;
  this->global_var_head_ = (vm_globalvar_t *)0x0;
  pCVar2 = (CVmHashTable *)operator_new(0x20);
  this_00 = (CVmObjNil *)operator_new(8);
  (this_00->super_CVmObject)._vptr_CVmObject = (_func_int **)0x0;
  CVmHashFuncCS::CVmHashFuncCS((CVmHashFuncCS *)this_00);
  CVmHashTable::CVmHashTable
            (in_stack_ffffffffffffffe0,(int)((ulong)this >> 0x20),(CVmHashFunc *)this_00,
             (int)((ulong)pCVar2 >> 0x20));
  this->post_load_init_table_ = pCVar2;
  alloc_new_page(in_stack_fffffffffffffff0);
  CVmObject::operator_new((size_t)this_00,(vm_obj_id_t)((ulong)pCVar2 >> 0x20));
  CVmObjNil::CVmObjNil(this_00);
  pCVar3 = get_entry(this,0);
  *(ushort *)&pCVar3->field_0x14 = *(ushort *)&pCVar3->field_0x14 & 0xfffe | 1;
  *(ushort *)&pCVar3->field_0x14 = *(ushort *)&pCVar3->field_0x14 & 0xfffd | 2;
  *(ushort *)&pCVar3->field_0x14 = *(ushort *)&pCVar3->field_0x14 & 0xfff3 | 8;
  *(ushort *)&pCVar3->field_0x14 = *(ushort *)&pCVar3->field_0x14 & 0xffcf;
  *(ushort *)&pCVar3->field_0x14 = *(ushort *)&pCVar3->field_0x14 & 0xffbf;
  *(ushort *)&pCVar3->field_0x14 = *(ushort *)&pCVar3->field_0x14 & 0xff7f;
  *(ushort *)&pCVar3->field_0x14 = *(ushort *)&pCVar3->field_0x14 & 0xfeff;
  *(ushort *)&pCVar3->field_0x14 = *(ushort *)&pCVar3->field_0x14 & 0xfdff;
  *(ushort *)&pCVar3->field_0x14 = *(ushort *)&pCVar3->field_0x14 & 0xfbff;
  return (int)pCVar3;
}

Assistant:

void CVmObjTable::init(VMG0_)
{
    /* allocate the initial set of page slots */
    page_slots_ = 10;
    pages_ = (CVmObjPageEntry **)t3malloc(page_slots_ * sizeof(*pages_));

    /* if that failed, throw an error */
    if (pages_ == 0)
        err_throw(VMERR_OUT_OF_MEMORY);

    /* no pages are in use yet */
    pages_used_ = 0;
    
    /* there are no free objects yet */
    first_free_ = 0;

    /* there's nothing in the GC work queue yet */
    gc_queue_head_ = VM_INVALID_OBJ;

    /* nothing in the finalizer work queue yet */
    finalize_queue_head_ = VM_INVALID_OBJ;

    /* we haven't allocated anything yet */
    allocs_since_gc_ = 0;
    bytes_since_gc_ = 0;

    /* 
     *   Set the upper limit for new objects and allocated bytes between
     *   garbage collection passes.
     *   
     *   In choosing these parameters, there's a trade-off.  Running more
     *   frequently reduces GC "stall time" of each pass (the time that the
     *   system is unresponsive while scanning for unreachable objects),
     *   because the total scanning on each pass will be smaller.  More
     *   frequent GC'ing also minimizes the working memory size by freeing
     *   garbage objects sooner after they become unreachable.  But running
     *   more frequently reduces *overall* program speed, since we spend more
     *   time in the collector in aggregate.  We have to scan the reachable
     *   objects on every pass, so the more frequently we run, the more
     *   unproductive time we'll spend scanning the same reachable objects
     *   over and over.
     *   
     *   TADS is specialized for highly interactive programs, so minimizing
     *   stall time is the overriding priority.  In practical testing, the
     *   stall time is imperceptible up to at least 30,000 objects between
     *   passes.  (It stays below 5 ms per run on an average 2007 desktop.
     *   The usual threshold of perceptibility is about 50-100 ms.)  Overall
     *   throughput seems to level out at about 20,000 objects between
     *   passes.  Beyond that, decreasing the frequency of gc runs yields
     *   diminishing returns.  The knee is the point where we're waiting long
     *   enough between passes that unreachable objects dominate.  Once
     *   you're at that frequency, going longer between passes won't improve
     *   speed much because you're typically just adding more garbage for the
     *   next pass.  The time you save by not doing a pass now gets canceled
     *   out by making the next pass longer by giving it more garbage to
     *   collect.  This is in contrast to running too frequently, where
     *   scanning reachable objects dominates: this time typically plateaus
     *   the longer you go between passes, since the reachable set itself
     *   tends to plateau in size over time, so while we're still in this
     *   zone, the longer you go between passes the better.)
     *   
     *   Although 20,000 allocations seems to be the best frequency for
     *   throughput for our test set, we currently set a somewhat more
     *   conservative limit (i.e., collect garbage more frequently).  This is
     *   because the assumptions in our test set don't apply to all programs.
     *   Some programs might allocate larger objects more frequently than our
     *   tests, and in those cases we don't want the working set to grow too
     *   quickly.  More frequenty GC will help avoid this.  
     *   
     *   In addition to the simple object allocation count, we also count
     *   bytes allocated between passes, and collect garbage if we go above a
     *   byte threshold independently of the object count.  This is to ensure
     *   that we collect garbage more frequently when very large objects are
     *   being used, to keep the working set from growing too fast.  Very
     *   large working sets can hurt performance by reducing locality of
     *   reference (for CPU caching) and even triggering OS-level disk
     *   swapping.
     */
//    max_allocs_between_gc_ = 17500;
    max_allocs_between_gc_ = 10000;
    max_bytes_between_gc_ = 6*1024*1024;

    /* enable the garbage collector */
    gc_enabled_ = TRUE;

    /* there are no saved image data pointers yet */
    image_ptr_head_ = 0;
    image_ptr_tail_ = 0;
    image_ptr_last_cnt_ = 0;

    /* no global pages yet */
    globals_ = 0;

    /* no global variables yet */
    global_var_head_ = 0;

    /* create the post_load_init() request table */
    post_load_init_table_ = new CVmHashTable(128, new CVmHashFuncCS(), TRUE);

    /* allocate the first object page */
    alloc_new_page();

    /* 
     *   Initialize object #0 with the nil pseudo-object.  This isn't an
     *   actual object, but it provides graceful error handling if the byte
     *   code attempts to invoke any methods on nil. 
     */
    new (vmg_ VM_INVALID_OBJ) CVmObjNil;
    CVmObjPageEntry *obj0 = get_entry(0);
    obj0->free_ = TRUE;
    obj0->in_root_set_ = TRUE;
    obj0->reachable_ = VMOBJ_REACHABLE;
    obj0->finalize_state_ = VMOBJ_UNFINALIZABLE;
    obj0->in_undo_ = FALSE;
    obj0->transient_ = FALSE;
    obj0->requested_post_load_init_ = FALSE;
    obj0->can_have_refs_ = FALSE;
    obj0->can_have_weak_refs_ = FALSE;
}